

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

NormalBlockISEInputs *
tcu::astc::anon_unknown_0::generateDefaultISEInputs
          (NormalBlockISEInputs *__return_storage_ptr__,NormalBlockParams *blockParams)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ISEMode IVar4;
  ISEParams IVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint numValuesInSequence;
  ulong uVar11;
  bool bVar12;
  
  (__return_storage_ptr__->weight).isGivenInBlockForm = false;
  (__return_storage_ptr__->endpoint).isGivenInBlockForm = false;
  IVar4 = (blockParams->weightISEParams).mode;
  iVar7 = blockParams->weightGridHeight * blockParams->weightGridWidth;
  bVar1 = blockParams->isDualPlane;
  bVar2 = bVar1 & 0x1f;
  uVar8 = iVar7 << bVar2;
  if (IVar4 == ISEMODE_PLAIN_BIT) {
    uVar10 = ~(-1 << ((byte)(blockParams->weightISEParams).numBits & 0x1f));
  }
  else {
    if (IVar4 == ISEMODE_QUINT) {
      bVar6 = (byte)(blockParams->weightISEParams).numBits;
      iVar9 = 5;
    }
    else {
      uVar10 = 0xffffffff;
      if (IVar4 != ISEMODE_TRIT) goto LAB_01a115c5;
      bVar6 = (byte)(blockParams->weightISEParams).numBits;
      iVar9 = 3;
    }
    uVar10 = (iVar9 << (bVar6 & 0x1f)) - 1;
  }
LAB_01a115c5:
  if (bVar1 == false) {
    if (0 < iVar7 << bVar2) {
      iVar7 = (int)((uVar8 - ((int)(uVar8 - 1) >> 0x1f)) + -1) >> 1;
      uVar11 = 0;
      do {
        *(int *)((long)&(__return_storage_ptr__->weight).value + uVar11 * 4) =
             iVar7 / (int)(uVar8 - 1);
        uVar11 = uVar11 + 1;
        iVar7 = iVar7 + uVar10;
      } while (uVar8 != uVar11);
    }
  }
  else {
    if (0 < iVar7 << bVar2) {
      iVar7 = (int)((uVar8 - ((int)(uVar8 - 1) >> 0x1f)) + -1) >> 1;
      uVar11 = 0;
      do {
        *(int *)((long)&(__return_storage_ptr__->weight).value + uVar11 * 4) =
             iVar7 / (int)(uVar8 - 1);
        uVar11 = uVar11 + 2;
        iVar7 = iVar7 + uVar10 * 2;
      } while (uVar11 < uVar8);
    }
    if (1 < (int)uVar8) {
      iVar7 = ((int)((uVar8 - ((int)(uVar8 - 1) >> 0x1f)) + -1) >> 1) + uVar10;
      uVar11 = 1;
      do {
        *(uint *)((long)&(__return_storage_ptr__->weight).value + uVar11 * 4) =
             uVar10 - iVar7 / (int)(uVar8 - 1);
        uVar11 = uVar11 + 2;
        iVar7 = iVar7 + uVar10 * 2;
      } while (uVar11 < uVar8);
    }
  }
  (__return_storage_ptr__->endpoint).isGivenInBlockForm = false;
  uVar10 = blockParams->numPartitions;
  if (blockParams->isMultiPartSingleCemMode == false) {
    if ((int)uVar10 < 1) {
      numValuesInSequence = 0;
    }
    else {
      uVar11 = 0;
      numValuesInSequence = 0;
      do {
        numValuesInSequence =
             numValuesInSequence + (blockParams->colorEndpointModes[uVar11] >> 2) * 2 + 2;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  else {
    numValuesInSequence = ((blockParams->colorEndpointModes[0] >> 2) * 2 + 2) * uVar10;
  }
  if (IVar4 == ISEMODE_PLAIN_BIT) {
    iVar7 = uVar8 * (blockParams->weightISEParams).numBits;
  }
  else {
    if (IVar4 == ISEMODE_QUINT) {
      iVar7 = (int)(uVar8 * 7) / 3;
      bVar12 = uVar8 * -0x55555553 + 0x2aaaaaaa < 0x55555555;
    }
    else {
      iVar7 = -1;
      if (IVar4 != ISEMODE_TRIT) goto LAB_01a11767;
      iVar7 = (int)(uVar8 * 8) / 5;
      bVar12 = uVar8 * 0x66666668 + 0x19999999 < 0x33333333;
    }
    iVar7 = uVar8 * (blockParams->weightISEParams).numBits + ((iVar7 + 1) - (uint)bVar12);
  }
LAB_01a11767:
  iVar9 = -0x1d;
  if (blockParams->isMultiPartSingleCemMode == false) {
    iVar9 = uVar10 * -3 + -0x19;
  }
  iVar3 = -0x11;
  if ((ulong)uVar10 != 1) {
    iVar3 = iVar9;
  }
  IVar5 = computeMaximumRangeISEParams
                    (((iVar3 + (uint)(bVar1 ^ 1) * 2) - iVar7) + 0x7e,numValuesInSequence);
  IVar4 = IVar5.mode;
  if (IVar4 == ISEMODE_PLAIN_BIT) {
    uVar8 = ~(-1 << ((byte)IVar5.numBits & 0x1f));
  }
  else {
    if (IVar4 == ISEMODE_QUINT) {
      iVar7 = 5;
    }
    else {
      uVar8 = 0xffffffff;
      if (IVar4 != ISEMODE_TRIT) goto LAB_01a117d7;
      iVar7 = 3;
    }
    uVar8 = (iVar7 << ((byte)IVar5.numBits & 0x1f)) - 1;
  }
LAB_01a117d7:
  if (0 < (int)numValuesInSequence) {
    iVar7 = (int)((numValuesInSequence - ((int)(numValuesInSequence - 1) >> 0x1f)) + -1) >> 1;
    uVar11 = 0;
    do {
      *(int *)((long)&(__return_storage_ptr__->endpoint).value + uVar11 * 4) =
           iVar7 / (int)(numValuesInSequence - 1);
      uVar11 = uVar11 + 1;
      iVar7 = iVar7 + uVar8;
    } while (numValuesInSequence != uVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

static NormalBlockISEInputs generateDefaultISEInputs (const NormalBlockParams& blockParams)
{
	NormalBlockISEInputs result;

	{
		result.weight.isGivenInBlockForm = false;

		const int numWeights		= computeNumWeights(blockParams);
		const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

		if (blockParams.isDualPlane)
		{
			for (int i = 0; i < numWeights; i += 2)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);

			for (int i = 1; i < numWeights; i += 2)
				result.weight.value.plain[i] = weightRangeMax - (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
		else
		{
			for (int i = 0; i < numWeights; i++)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
	}

	{
		result.endpoint.isGivenInBlockForm = false;

		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);
		const int			colorEndpointRangeMax		= computeISERangeMax(colorEndpointISEParams);

		for (int i = 0; i < numColorEndpointValues; i++)
			result.endpoint.value.plain[i] = (i*colorEndpointRangeMax + (numColorEndpointValues-1)/2) / (numColorEndpointValues-1);
	}

	return result;
}